

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_base_clock(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  envy_bios_power_base_clock_entry *peVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  envy_bios_power_base_clock_entry *peVar9;
  uint16_t *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint16_t clock;
  ulong local_38;
  
  uVar12 = (bios->power).base_clock.offset;
  if (uVar12 == 0) {
    return -0x16;
  }
  bios_u8(bios,uVar12,&(bios->power).base_clock.version);
  uVar1 = (bios->power).base_clock.version;
  if (uVar1 == ' ') {
    iVar4 = bios_u8(bios,(bios->power).base_clock.offset + 1,&(bios->power).base_clock.hlen);
    iVar5 = bios_u8(bios,(bios->power).base_clock.offset + 2,&(bios->power).base_clock.rlen);
    iVar6 = bios_u8(bios,(bios->power).base_clock.offset + 3,&(bios->power).base_clock.entriesnum);
    iVar7 = bios_u8(bios,(bios->power).base_clock.offset + 4,&(bios->power).base_clock.secount);
    iVar8 = bios_u8(bios,(bios->power).base_clock.offset + 5,&(bios->power).base_clock.selen);
    (bios->power).base_clock.valid =
         iVar8 == 0 && ((iVar7 == 0 && iVar6 == 0) && (iVar5 == 0 && iVar4 == 0));
    if (iVar8 != 0 || ((iVar7 != 0 || iVar6 != 0) || (iVar5 != 0 || iVar4 != 0))) {
      return -0x16;
    }
    bios_u8(bios,(bios->power).base_clock.offset + 6,&(bios->power).base_clock.boost_entry);
    bios_u8(bios,(bios->power).base_clock.offset + 7,&(bios->power).base_clock.turbo_boost_entry);
    bios_u8(bios,(bios->power).base_clock.offset + 8,&(bios->power).base_clock.rated_tdp_entry);
    bios_u8(bios,(bios->power).base_clock.offset + 0xc,&(bios->power).base_clock.vrhot_entry);
    bios_u8(bios,(bios->power).base_clock.offset + 0xd,&(bios->power).base_clock.max_batt_entry);
    bios_u8(bios,(bios->power).base_clock.offset + 0xe,&(bios->power).base_clock.unk15_entry);
    uVar12 = (bios->power).base_clock.offset + 0xf;
LAB_00259dc1:
    bios_u8(bios,uVar12,&(bios->power).base_clock.unk16_entry);
    goto LAB_00259dfc;
  }
  if (uVar1 != '\x10') {
    fprintf(_stderr,"BASE CLOCKS table version 0x%x\n");
    return -0x16;
  }
  iVar4 = bios_u8(bios,(bios->power).base_clock.offset + 1,&(bios->power).base_clock.hlen);
  iVar5 = bios_u8(bios,(bios->power).base_clock.offset + 2,&(bios->power).base_clock.rlen);
  iVar6 = bios_u8(bios,(bios->power).base_clock.offset + 3,&(bios->power).base_clock.selen);
  iVar7 = bios_u8(bios,(bios->power).base_clock.offset + 4,&(bios->power).base_clock.secount);
  iVar8 = bios_u8(bios,(bios->power).base_clock.offset + 5,&(bios->power).base_clock.entriesnum);
  (bios->power).base_clock.valid =
       iVar8 == 0 && ((iVar7 == 0 && iVar6 == 0) && (iVar5 == 0 && iVar4 == 0));
  if (iVar8 != 0 || ((iVar7 != 0 || iVar6 != 0) || (iVar5 != 0 || iVar4 != 0))) {
    return -0x16;
  }
  bios_u8(bios,(bios->power).base_clock.offset + 6,&(bios->power).base_clock.d2_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 7,&(bios->power).base_clock.d3_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 8,&(bios->power).base_clock.d4_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 9,&(bios->power).base_clock.d5_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 10,&(bios->power).base_clock.over_current_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 0xb,&(bios->power).base_clock.vrhot_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 0xc,&(bios->power).base_clock.max_batt_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 0xd,&(bios->power).base_clock.max_sli_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 0xe,
          &(bios->power).base_clock.max_therm_sustain_entry);
  bios_u8(bios,(bios->power).base_clock.offset + 0xf,&(bios->power).base_clock.boost_entry);
  if ((bios->power).base_clock.hlen < 0x11) {
    (bios->power).base_clock.turbo_boost_entry = 0xff;
LAB_00259dd9:
    (bios->power).base_clock.rated_tdp_entry = 0xff;
LAB_00259de0:
    (bios->power).base_clock.slowdown_pwr_entry = 0xff;
LAB_00259de7:
    (bios->power).base_clock.mid_point_entry = 0xff;
LAB_00259dee:
    (bios->power).base_clock.unk15_entry = 0xff;
  }
  else {
    bios_u8(bios,(bios->power).base_clock.offset + 0x10,&(bios->power).base_clock.turbo_boost_entry)
    ;
    if ((bios->power).base_clock.hlen < 0x12) goto LAB_00259dd9;
    bios_u8(bios,(bios->power).base_clock.offset + 0x11,&(bios->power).base_clock.rated_tdp_entry);
    if ((bios->power).base_clock.hlen < 0x13) goto LAB_00259de0;
    bios_u8(bios,(bios->power).base_clock.offset + 0x12,&(bios->power).base_clock.slowdown_pwr_entry
           );
    if ((bios->power).base_clock.hlen < 0x14) goto LAB_00259de7;
    bios_u8(bios,(bios->power).base_clock.offset + 0x13,&(bios->power).base_clock.mid_point_entry);
    if ((bios->power).base_clock.hlen < 0x16) goto LAB_00259dee;
    bios_u8(bios,(bios->power).base_clock.offset + 0x15,&(bios->power).base_clock.unk15_entry);
    if (0x16 < (bios->power).base_clock.hlen) {
      uVar12 = (bios->power).base_clock.offset + 0x16;
      goto LAB_00259dc1;
    }
  }
  (bios->power).base_clock.unk16_entry = 0xff;
LAB_00259dfc:
  uVar13 = (ulong)(bios->power).base_clock.entriesnum;
  peVar9 = (envy_bios_power_base_clock_entry *)malloc(uVar13 * 0x18);
  (bios->power).base_clock.entries = peVar9;
  for (local_38 = 0; local_38 < uVar13; local_38 = local_38 + 1) {
    peVar3 = (bios->power).base_clock.entries;
    peVar9 = peVar3 + local_38;
    uVar12 = (int)local_38 *
             ((uint)(bios->power).base_clock.secount * (uint)(bios->power).base_clock.selen +
             (uint)(bios->power).base_clock.rlen) +
             (uint)(bios->power).base_clock.hlen + (bios->power).base_clock.offset;
    peVar3 = peVar3 + local_38;
    peVar3->offset = uVar12;
    bios_u8(bios,uVar12,&peVar3->pstate);
    if ((bios->power).base_clock.version == '\x10') {
      bios_u16(bios,peVar9->offset + 1,&peVar9->reqPower);
      bios_u16(bios,peVar9->offset + 3,&peVar9->reqSlowdownPower);
    }
    bVar2 = (bios->power).base_clock.secount;
    puVar10 = (uint16_t *)malloc((ulong)((uint)bVar2 * 2));
    peVar9->clock = puVar10;
    lVar11 = 0;
    for (uVar13 = 0; uVar13 < bVar2; uVar13 = uVar13 + 1) {
      uVar12 = (uint)(bios->power).base_clock.selen * (int)uVar13 +
               (uint)(bios->power).base_clock.rlen + peVar9->offset;
      uVar1 = (bios->power).base_clock.version;
      if (uVar1 == ' ') {
        bios_u16(bios,uVar12 + 2,&clock);
        *(uint16_t *)((long)peVar9->clock + lVar11) = clock << 2;
      }
      else if (uVar1 == '\x10') {
        bios_u16(bios,uVar12,(uint16_t *)((long)peVar9->clock + lVar11));
      }
      bVar2 = (bios->power).base_clock.secount;
      lVar11 = lVar11 + 2;
    }
    uVar13 = (ulong)(bios->power).base_clock.entriesnum;
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_base_clock(struct envy_bios *bios) {
	struct envy_bios_power_base_clock *bc = &bios->power.base_clock;
	int i, j, err = 0;

	if (!bc->offset)
		return -EINVAL;

	bios_u8(bios, bc->offset + 0x0, &bc->version);
	switch(bc->version) {
	case 0x10:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->selen);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->entriesnum);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->d2_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->d3_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->d4_entry);
			bios_u8(bios, bc->offset + 0x09, &bc->d5_entry);
			bios_u8(bios, bc->offset + 0x0a, &bc->over_current_entry);
			bios_u8(bios, bc->offset + 0x0b, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_sli_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->max_therm_sustain_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->boost_entry);
			if (bc->hlen > 0x10)
				bios_u8(bios, bc->offset + 0x10, &bc->turbo_boost_entry);
			else
				bc->turbo_boost_entry = 0xff;
			if (bc->hlen > 0x11)
				bios_u8(bios, bc->offset + 0x11, &bc->rated_tdp_entry);
			else
				bc->rated_tdp_entry = 0xff;
			if (bc->hlen > 0x12)
				bios_u8(bios, bc->offset + 0x12, &bc->slowdown_pwr_entry);
			else
				bc->slowdown_pwr_entry = 0xff;
			if (bc->hlen > 0x13)
				bios_u8(bios, bc->offset + 0x13, &bc->mid_point_entry);
			else
				bc->mid_point_entry = 0xff;
			if (bc->hlen > 0x15)
				bios_u8(bios, bc->offset + 0x15, &bc->unk15_entry);
			else
				bc->unk15_entry = 0xff;
			if (bc->hlen > 0x16)
				bios_u8(bios, bc->offset + 0x16, &bc->unk16_entry);
			else
				bc->unk16_entry = 0xff;
		} else {
			return -EINVAL;
		}

		break;
	case 0x20:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->entriesnum);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->selen);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->boost_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->turbo_boost_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->rated_tdp_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->unk15_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->unk16_entry);
		} else {
			return -EINVAL;
		}

		break;
	default:
		ENVY_BIOS_ERR("BASE CLOCKS table version 0x%x\n", bc->version);
		return -EINVAL;
	};

	err = 0;
	bc->entries = malloc(bc->entriesnum * sizeof(struct envy_bios_power_base_clock_entry));
	for (i = 0; i < bc->entriesnum; i++) {
		struct envy_bios_power_base_clock_entry *bce = &bc->entries[i];

		bce->offset = bc->offset + bc->hlen + i * (bc->rlen + (bc->selen * bc->secount));
		bios_u8(bios, bce->offset, &bce->pstate);

		if (bc->version == 0x10) {
			bios_u16(bios, bce->offset + 0x1, &bce->reqPower);
			bios_u16(bios, bce->offset + 0x3, &bce->reqSlowdownPower);
		}

		bce->clock = malloc(bc->secount * sizeof(uint16_t));
		for (j = 0; j < bc->secount; j++) {
			uint32_t suboffset = bce->offset + bc->rlen + j * bc->selen;
			uint16_t clock;
			switch (bc->version) {
			case 0x10:
				bios_u16(bios, suboffset, &bce->clock[j]);
				break;
			case 0x20:
				bios_u16(bios, suboffset + 0x2, &clock);
				bce->clock[j] = clock * 4;
				break;
			}
		}
	}

	return 0;
}